

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int i;
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_ge q;
  secp256k1_gej pr;
  uchar c [32];
  secp256k1_gej pubkeyj;
  secp256k1_fe aux [4];
  secp256k1_strauss_point_state ps [1];
  uint local_870;
  secp256k1_scalar local_86c;
  secp256k1_scalar local_868;
  secp256k1_scalar local_864;
  secp256k1_strauss_state local_860;
  secp256k1_ge local_848;
  secp256k1_gej local_7e0;
  secp256k1_ge local_748 [4];
  secp256k1_gej local_5a0;
  secp256k1_fe local_508 [4];
  secp256k1_strauss_point_state local_448;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_verify_cold_4();
  }
  else if (msghash32 != (uchar *)0x0) {
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_verify_cold_2();
      return 0;
    }
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_ecdsa_verify_cold_1();
      return 0;
    }
    lVar2 = 0;
    uVar6 = 0;
    do {
      uVar5 = (uint)msghash32[lVar2] | uVar6 << 8;
      uVar6 = uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc);
      if (uVar5 < 0xd) {
        uVar6 = uVar5;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    uVar5 = 0;
    do {
      uVar3 = (uint)sig->data[lVar2] | uVar5 << 8;
      uVar5 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar5 = uVar3;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = (uint)sig->data[lVar2 + 0x20] | uVar3 << 8;
      uVar3 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      if (uVar4 < 0xd) {
        uVar3 = uVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    if (6 < uVar3) {
      return 0;
    }
    local_870 = uVar3;
    iVar1 = secp256k1_pubkey_load(ctx,&local_848,pubkey);
    if (iVar1 == 0) {
      return 0;
    }
    if (uVar5 != 0) {
      if (uVar3 == 0) {
        return 0;
      }
      secp256k1_scalar_inverse(&local_864,&local_870);
      uVar6 = uVar6 * local_864;
      local_868 = uVar6 - (uVar6 / 0xd + (uVar6 / 0xd) * 0xc);
      uVar6 = local_864 * uVar5;
      local_86c = uVar6 - (uVar6 / 0xd + (uVar6 / 0xd) * 0xc);
      secp256k1_gej_set_ge(&local_5a0,&local_848);
      local_860.aux = local_508;
      local_860.pre_a = local_748;
      local_860.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf(&local_860,&local_7e0,1,&local_5a0,&local_86c,&local_868);
      secp256k1_gej_verify(&local_7e0);
      if (local_7e0.infinity == 0) {
        secp256k1_ge_set_gej((secp256k1_ge *)&local_448,&local_7e0);
        secp256k1_fe_normalize((secp256k1_fe *)&local_448);
        secp256k1_fe_get_b32((uchar *)local_748,(secp256k1_fe *)&local_448);
        lVar2 = 0;
        uVar6 = 0;
        do {
          uVar3 = (uint)*(byte *)((long)local_748[0].x.n + lVar2) | uVar6 << 8;
          uVar6 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
          if (uVar3 < 0xd) {
            uVar6 = uVar3;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x20);
        return (uint)(uVar5 == uVar6);
      }
      return 0;
    }
    return 0;
  }
  secp256k1_ecdsa_verify_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}